

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_elements_confidentialtransaction.cpp
# Opt level: O0

void __thiscall
ConfidentialTransaction_GetBitcoinTransactionTest_Test::
~ConfidentialTransaction_GetBitcoinTransactionTest_Test
          (ConfidentialTransaction_GetBitcoinTransactionTest_Test *this)

{
  ConfidentialTransaction_GetBitcoinTransactionTest_Test *this_local;
  
  ~ConfidentialTransaction_GetBitcoinTransactionTest_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST(ConfidentialTransaction, GetBitcoinTransactionTest) {
  // no witness
  ByteData no_witness_data(
      "010000000136641869ca081e70f394c6948e8af409e18b619df2ed74aa106c1ca29787b96e0100000023220020a16b5755f7f6f96dbd65f5f0d6ab9418b89af4b1f14a1bb8a09062c35f0dcb54ffffffff0200e9a435000000001976a914389ffce9cd9ae88dcc0631e88a821ffdbe9bfe2688acc0832f05000000001976a9147480a33f950689af511e6e84c138dbbd3c3ee41588ac00000000");
  ByteData conv_nowit;
  EXPECT_NO_THROW(
      (conv_nowit = ConfidentialTransaction::GetBitcoinTransaction(
          no_witness_data)));
  EXPECT_STREQ(no_witness_data.GetHex().c_str(), conv_nowit.GetHex().c_str());

  // witness
  ByteData witness_data(
      "02000000000101d0b871d1a1c019d060e46878e6853c16a886fad7a7bdddcd199b1f4975952dcd0000000000ffffffff01b0069a3b0000000016001405dca32c20abe66ec786bc114fd67ad83e70868d024730440220533dda726705cbbae9cfb8e7a6ccbce581f3db9bb58ab923e71ae8de0e309280022004614f3bf2b7b11bbd02b382d206b9e0b7cba67c682dd88481f712cca2cc3f9d0121036b67e1bd3bd3efbc37fdc738ab159a4aa527057eae12a0c4b07d3132580dcdfd00000000");
  ByteData conv_wit;
  EXPECT_NO_THROW(
      (conv_wit = ConfidentialTransaction::GetBitcoinTransaction(witness_data,
                                                                 false)));
  EXPECT_STREQ(witness_data.GetHex().c_str(), conv_wit.GetHex().c_str());

  ByteData conv_rmwit;
  EXPECT_NO_THROW(
      (conv_rmwit = ConfidentialTransaction::GetBitcoinTransaction(witness_data,
                                                                   true)));
  EXPECT_STREQ(
      "0200000001d0b871d1a1c019d060e46878e6853c16a886fad7a7bdddcd199b1f4975952dcd0000000000ffffffff01b0069a3b0000000016001405dca32c20abe66ec786bc114fd67ad83e70868d00000000",
      conv_rmwit.GetHex().c_str());
}